

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.h
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> *
gmath::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,SVector<double,_6> *a)

{
  int i;
  long lVar1;
  
  lVar1 = 1;
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  std::ostream::_M_insert<double>(a->v[0]);
  do {
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    std::ostream::_M_insert<double>(a->v[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
  return out;
}

Assistant:

std::basic_ostream<Ch, Tr> &operator<<(std::basic_ostream<Ch, Tr> &out, const SVector<T, n> &a)
{
  out << "[" << a[0];

  for (int i=1; i<n; i++)
  {
    out << " " << a[i];
  }

  out << "]";

  return out;
}